

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<IntrusiveListIteratorTest_rbegin_rend_forward_Test>::CreateTest
          (TestFactoryImpl<IntrusiveListIteratorTest_rbegin_rend_forward_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<IntrusiveListIteratorTest_rbegin_rend_forward_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x30);
  IntrusiveListIteratorTest_rbegin_rend_forward_Test::
  IntrusiveListIteratorTest_rbegin_rend_forward_Test
            ((IntrusiveListIteratorTest_rbegin_rend_forward_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }